

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select_Game.cpp
# Opt level: O1

double __thiscall SelectGame::selectGame_Option(SelectGame *this,double *credits)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  PrintGameName printWelcome;
  uint bet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector;
  Matrix myMatrix;
  string option;
  CreditField addCredit;
  Bet currentBet;
  PrintGameName local_12d;
  uint local_12c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_128;
  Matrix local_108;
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  Start local_d0;
  Bet local_a8;
  SelectGame *local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_f0 = local_e0;
  local_e8 = 0;
  local_e0[0] = '\0';
  local_98 = this;
  do {
    selectGame_Welcome(local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Choose a game which you want to Play!",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Option: 1 for SuperFire 5",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Option: 2 for SuperFire 10",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Option: 3 for Wise Pharaohs 5",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Option: 4 for Tiger\'s Battle 10",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Option: 5 for Keno",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press a to add credit!",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press c to exit!",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current Credit: ",0x10);
    poVar2 = std::ostream::_M_insert<double>(*credits);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro!",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&local_f0);
    if ((*local_f0 == 'a') && (local_e8 == 1)) {
      CreditField::CreditField((CreditField *)&local_d0);
      CreditField::AddCredit((CreditField *)&local_d0,credits);
      CreditField::~CreditField((CreditField *)&local_d0);
    }
    if ((*local_f0 == 'c') && (local_e8 == 1)) {
      if (*credits <= 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Nothing to cashout!",0x13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        local_d0.super_Matrix._matrixVec.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
        local_d0.super_Matrix._matrixVec.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        do {
          iVar1 = nanosleep((timespec *)&local_d0,(timespec *)&local_d0);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Handpay! Call Attendant! ",0x19);
        poVar2 = std::ostream::_M_insert<double>(*credits);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro!",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        local_d0.super_Matrix._matrixVec.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
        local_d0.super_Matrix._matrixVec.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        do {
          iVar1 = nanosleep((timespec *)&local_d0,(timespec *)&local_d0);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
        *credits = 0.0;
      }
    }
    if ((*local_f0 == '1') && (local_e8 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcome(&local_12d);
      if (*credits <= 1.0 && *credits != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "----------------------------------------------------------------------",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        CreditField::CreditField((CreditField *)&local_d0);
        CreditField::AddCredit((CreditField *)&local_d0,credits);
        CreditField::~CreditField((CreditField *)&local_d0);
      }
      local_12c = 0;
      Bet::Bet(&local_a8,0,*credits);
      Bet::selectBet(&local_a8,&local_12c,credits);
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_48,&local_128);
      Matrix::Matrix(&local_108,&local_48);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      Start::Start(&local_d0,*credits,local_12c);
      Start::StartGameNow(&local_d0,credits,&local_12c);
      Start::~Start(&local_d0);
      Matrix::~Matrix(&local_108);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_128);
      Bet::~Bet(&local_a8);
      PrintGameName::~PrintGameName(&local_12d);
    }
    if ((*local_f0 == '2') && (local_e8 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcomeSuperFire10(&local_12d);
      if (*credits <= 2.0 && *credits != 2.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "----------------------------------------------------------------------",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        CreditField::CreditField((CreditField *)&local_d0);
        CreditField::AddCredit((CreditField *)&local_d0,credits);
        CreditField::~CreditField((CreditField *)&local_d0);
      }
      local_12c = 0;
      Bet::Bet(&local_a8,0,*credits);
      Bet::selectBetSuperFire10(&local_a8,&local_12c,credits);
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_60,&local_128);
      Matrix::Matrix(&local_108,&local_60);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      Start::Start(&local_d0,*credits,local_12c);
      Start::StartGameNowSuperFire10(&local_d0,credits,&local_12c);
      Start::~Start(&local_d0);
      Matrix::~Matrix(&local_108);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_128);
      Bet::~Bet(&local_a8);
      PrintGameName::~PrintGameName(&local_12d);
    }
    if ((*local_f0 == '3') && (local_e8 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcomeWisePharaohs5(&local_12d);
      if (*credits <= 1.0 && *credits != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "----------------------------------------------------------------------",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        CreditField::CreditField((CreditField *)&local_d0);
        CreditField::AddCredit((CreditField *)&local_d0,credits);
        CreditField::~CreditField((CreditField *)&local_d0);
      }
      local_12c = 0;
      Bet::Bet(&local_a8,0,*credits);
      Bet::selectBetWisePharaohs(&local_a8,&local_12c,credits);
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_78,&local_128);
      MatrixPharaohs::MatrixPharaohs((MatrixPharaohs *)&local_108,&local_78);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_78);
      Start::Start(&local_d0,*credits,local_12c);
      Start::StartGameNowWisePharaohs5(&local_d0,credits,&local_12c);
      Start::~Start(&local_d0);
      MatrixPharaohs::~MatrixPharaohs((MatrixPharaohs *)&local_108);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_128);
      Bet::~Bet(&local_a8);
      PrintGameName::~PrintGameName(&local_12d);
    }
    if ((*local_f0 == '4') && (local_e8 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcomeTigersBattle10(&local_12d);
      if (*credits <= 2.0 && *credits != 2.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "----------------------------------------------------------------------",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        CreditField::CreditField((CreditField *)&local_d0);
        CreditField::AddCredit((CreditField *)&local_d0,credits);
        CreditField::~CreditField((CreditField *)&local_d0);
      }
      local_12c = 0;
      Bet::Bet(&local_a8,0,*credits);
      Bet::selectBetTigersBattle10(&local_a8,&local_12c,credits);
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_90,&local_128);
      Matrix::Matrix(&local_108,&local_90);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_90);
      Start::Start(&local_d0,*credits,local_12c);
      Start::StartGameNowTigersBattle10(&local_d0,credits,&local_12c);
      Start::~Start(&local_d0);
      Matrix::~Matrix(&local_108);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_128);
      Bet::~Bet(&local_a8);
      PrintGameName::~PrintGameName(&local_12d);
    }
    if ((*local_f0 == '5') && (local_e8 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)&local_a8);
      PrintGameName::PrintGameNameWelcomeKeno((PrintGameName *)&local_a8);
      if (*credits <= 1.0 && *credits != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "----------------------------------------------------------------------",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        CreditField::CreditField((CreditField *)&local_d0);
        CreditField::AddCredit((CreditField *)&local_d0,credits);
        CreditField::~CreditField((CreditField *)&local_d0);
      }
      local_108._matrixVec.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      Bet::Bet((Bet *)&local_128,0,*credits);
      Bet::selectBetKeno((Bet *)&local_128,(uint *)&local_108,credits);
      Start::Start(&local_d0,*credits,
                   (uint)local_108._matrixVec.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      Start::StartGameNowKeno(&local_d0,credits,(uint *)&local_108);
      Start::~Start(&local_d0);
      Bet::~Bet((Bet *)&local_128);
      PrintGameName::~PrintGameName((PrintGameName *)&local_a8);
    }
  } while( true );
}

Assistant:

double SelectGame::selectGame_Option(double & credits) {
	std::string option;
	bool neverExit =false;
	while (neverExit==false) {
		selectGame_Welcome();
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Choose a game which you want to Play!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Option: 1 for SuperFire 5" << std::endl;
		std::cout << "Option: 2 for SuperFire 10" << std::endl;
		std::cout << "Option: 3 for Wise Pharaohs 5" << std::endl;
		std::cout << "Option: 4 for Tiger's Battle 10" << std::endl;
		std::cout << "Option: 5 for Keno" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Press a to add credit!" << std::endl;
		std::cout << "Press c to exit!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cin >> option;

		if (option[0] == 'a' && option.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (option[0] == 'c' && option.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				std::chrono::seconds duration(3);
				std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				std::chrono::seconds duration(3);
				std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (option[0] == '1' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcome();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBet(bet, credits);

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNow(credits, bet);
		}
		if (option[0] == '2' && option.size() == 1) {
				//clear console
			if (system("CLS")) system("clear");
				//welcome game
				PrintGameName printWelcome;
				printWelcome.PrintGameNameWelcomeSuperFire10();
				//credit
			if (credits < 2) {
					std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
					std::cout << "----------------------------------------------------------------------" << std::endl;
					CreditField myCredit;
					myCredit.AddCredit(credits);
			}
			
			//bet
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetSuperFire10(bet, credits);

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowSuperFire10(credits, bet);
		}
		// Wise Pharaohs 5 
		if (option[0] == '3' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeWisePharaohs5();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetWisePharaohs(bet, credits);

			//matrix 2D
			//need to change
			std::vector<std::vector<int>> myMatrixVector;
			MatrixPharaohs myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowWisePharaohs5(credits, bet); 
		}

		if (option[0] == '4' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeTigersBattle10(); // changed
			//credit
			if (credits < 2) {
				std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetTigersBattle10(bet, credits); //changed  bet 2 euro

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowTigersBattle10(credits, bet); //changed
		}
		if (option[0] == '5' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeKeno();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetKeno(bet, credits);

			//matrix 2D
			/*std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);*/

			//starting a game

			Start startGame(credits, bet);
			startGame.StartGameNowKeno(credits, bet);
		}
	}
	return credits;
}